

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O1

PcodeOp * __thiscall FlowInfo::branchTarget(FlowInfo *this,PcodeOp *op)

{
  Varnode *pVVar1;
  PcodeOp *pPVar2;
  Address res;
  Address local_18;
  
  pVVar1 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((pVVar1->loc).base)->type != IPTR_CONSTANT) {
    pPVar2 = target(this,&pVVar1->loc);
    return pPVar2;
  }
  local_18.base = (AddrSpace *)0x0;
  pPVar2 = findRelTarget(this,op,&local_18);
  if (pPVar2 == (PcodeOp *)0x0) {
    pPVar2 = target(this,&local_18);
  }
  return pPVar2;
}

Assistant:

PcodeOp *FlowInfo::branchTarget(PcodeOp *op) const

{
  const Address &addr(op->getIn(0)->getAddr());
  if (addr.isConstant()) {	// This is a relative sequence number
    Address res;
    PcodeOp *retop = findRelTarget(op,res);
    if (retop != (PcodeOp *)0)
      return retop;
    return target(res);
  }
  return target(addr);	// Otherwise a normal address target
}